

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::HugeIntegerCastOperation::
     HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
               (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *state,
               uint8_t digit)

{
  bool bVar1;
  ulong uVar2;
  undefined3 in_register_00000031;
  
  uVar2 = state->intermediate;
  if (~(ulong)CONCAT31(in_register_00000031,digit) / 10 < uVar2) {
    bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::Flush(state);
    if (!bVar1) {
      return false;
    }
    uVar2 = state->intermediate;
  }
  state->intermediate = (ulong)CONCAT31(in_register_00000031,digit) + uVar2 * 10;
  state->digits = state->digits + '\x01';
  return true;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.intermediate <
			                    (NumericLimits<typename T::IntermediateType>::Minimum() + digit) / 10)) {
				// intermediate is full: need to flush it
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 - digit;
		} else {
			if (DUCKDB_UNLIKELY(state.intermediate >
			                    (NumericLimits<typename T::IntermediateType>::Maximum() - digit) / 10)) {
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 + digit;
		}
		state.digits++;
		return true;
	}